

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

void Wln_RetMarkChanges(Wln_Ret_t *p,Vec_Int_t *vFront)

{
  uint uVar1;
  int iVar2;
  Wln_Ntk_t *pWVar3;
  int *piVar4;
  long lVar5;
  
  if (vFront == (Vec_Int_t *)0x0) {
    uVar1 = (p->pNtk->vTypes).nSize;
    if ((p->vPathDelays).nCap < (int)uVar1) {
      piVar4 = (p->vPathDelays).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
      }
      (p->vPathDelays).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vPathDelays).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vPathDelays).pArray,0xff,(ulong)uVar1 * 4);
    }
    (p->vPathDelays).nSize = uVar1;
    pWVar3 = p->pNtk;
    if (0 < (pWVar3->vCis).nSize) {
      piVar4 = (pWVar3->vCis).pArray;
      lVar5 = 0;
      do {
        iVar2 = piVar4[lVar5];
        if (((long)iVar2 < 0) || ((p->vPathDelays).nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vPathDelays).pArray[iVar2] = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 < (pWVar3->vCis).nSize);
    }
  }
  else if (0 < vFront->nSize) {
    lVar5 = 0;
    do {
      Wln_RetMarkChanges_rec(p,vFront->pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vFront->nSize);
  }
  return;
}

Assistant:

void Wln_RetMarkChanges( Wln_Ret_t * p, Vec_Int_t * vFront )
{
    int i, iObj;
    if ( vFront )
    {
        Vec_IntForEachEntry( vFront, iObj, i )
            Wln_RetMarkChanges_rec( p, iObj );
    }
    else
    {
        Vec_IntFill( &p->vPathDelays, Wln_NtkObjNum(p->pNtk), -1 );
        Wln_NtkForEachCi( p->pNtk, iObj, i )
            Vec_IntWriteEntry( &p->vPathDelays, iObj, 0 );
    }
}